

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

void __thiscall QLibrary::~QLibrary(QLibrary *this)

{
  ulong uVar1;
  
  (this->super_QObject)._vptr_QObject = (_func_int **)&PTR_metaObject_0066d6e0;
  uVar1 = (this->d).d;
  if (7 < uVar1) {
    QLibraryStore::releaseLibrary((QLibraryPrivate *)(uVar1 & 0xfffffffffffffff8));
  }
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QLibrary::~QLibrary()
{
    if (d)
        d->release();
}